

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFYAML.h
# Opt level: O3

void llvm::yaml::ScalarEnumerationTraits<llvm::dwarf::LineNumberExtendedOps,_void>::enumeration
               (IO *io,LineNumberExtendedOps *value)

{
  int iVar1;
  
  iVar1 = (*io->_vptr_IO[2])();
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_LNE_end_sequence",(ulong)(*value == DW_LNE_end_sequence & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_LNE_end_sequence;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_LNE_set_address",(ulong)(*value == DW_LNE_set_address & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_LNE_set_address;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_LNE_define_file",(ulong)(*value == DW_LNE_define_file & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_LNE_define_file;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_LNE_set_discriminator",
                     (ulong)(*value == DW_LNE_set_discriminator & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_LNE_set_discriminator;
  }
  IO::enumFallback<llvm::yaml::Hex16,llvm::dwarf::LineNumberExtendedOps>(io,value);
  return;
}

Assistant:

static void enumeration(IO &io, dwarf::LineNumberExtendedOps &value) {
#include "llvm/BinaryFormat/Dwarf.def"
    io.enumFallback<Hex16>(value);
  }